

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_vectors.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
compute_average(Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this,
               vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
               *to_average)

{
  double dVar1;
  pointer pdVar2;
  size_type sVar3;
  pointer pdVar4;
  const_reference ppVVar5;
  reference pvVar6;
  undefined1 auVar7 [16];
  size_type local_c0;
  size_t i_2;
  size_t j;
  size_t i_1;
  allocator<double> local_91;
  value_type_conflict1 local_90;
  undefined1 local_88 [8];
  vector<double,_std::allocator<double>_> av;
  size_t i;
  size_t maximal_length_of_vector;
  vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
  *local_18;
  vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
  *to_average_local;
  Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this_local;
  
  local_18 = to_average;
  to_average_local =
       (vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
        *)this;
  sVar3 = std::
          vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
          ::size(to_average);
  if (sVar3 == 0) {
    Vector_distances_in_diagram
              ((Vector_distances_in_diagram<Gudhi::Euclidean_distance> *)&maximal_length_of_vector);
    operator=(this,(Vector_distances_in_diagram<Gudhi::Euclidean_distance> *)
                   &maximal_length_of_vector);
    ~Vector_distances_in_diagram
              ((Vector_distances_in_diagram<Gudhi::Euclidean_distance> *)&maximal_length_of_vector);
  }
  else {
    i = 0;
    av.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    while( true ) {
      pdVar2 = av.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar4 = (pointer)std::
                        vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
                        ::size(local_18);
      if (pdVar2 == pdVar4) break;
      ppVVar5 = std::
                vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
                ::operator[](local_18,(size_type)
                                      av.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                      .super__Vector_impl_data._M_end_of_storage);
      sVar3 = std::vector<double,_std::allocator<double>_>::size
                        (&(*ppVVar5)->sorted_vector_of_distances);
      if (i < sVar3) {
        ppVVar5 = std::
                  vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
                  ::operator[](local_18,(size_type)
                                        av.super__Vector_base<double,_std::allocator<double>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
        i = std::vector<double,_std::allocator<double>_>::size
                      (&(*ppVVar5)->sorted_vector_of_distances);
      }
      av.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((long)av.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 1);
    }
    local_90 = 0.0;
    std::allocator<double>::allocator(&local_91);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_88,i,&local_90,&local_91);
    std::allocator<double>::~allocator(&local_91);
    j = 0;
    while( true ) {
      sVar3 = std::
              vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
              ::size(local_18);
      if (j == sVar3) break;
      i_2 = 0;
      while( true ) {
        ppVVar5 = std::
                  vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
                  ::operator[](local_18,j);
        sVar3 = std::vector<double,_std::allocator<double>_>::size
                          (&(*ppVVar5)->sorted_vector_of_distances);
        if (i_2 == sVar3) break;
        ppVVar5 = std::
                  vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
                  ::operator[](local_18,j);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(*ppVVar5)->sorted_vector_of_distances,i_2);
        dVar1 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_88,i_2);
        *pvVar6 = dVar1 + *pvVar6;
        i_2 = i_2 + 1;
      }
      j = j + 1;
    }
    for (local_c0 = 0; local_c0 != i; local_c0 = local_c0 + 1) {
      sVar3 = std::
              vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
              ::size(local_18);
      auVar7._8_4_ = (int)(sVar3 >> 0x20);
      auVar7._0_8_ = sVar3;
      auVar7._12_4_ = 0x45300000;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_88,local_c0);
      *pvVar6 = *pvVar6 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
    }
    std::vector<double,_std::allocator<double>_>::operator=
              (&this->sorted_vector_of_distances,(vector<double,_std::allocator<double>_> *)local_88
              );
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_88);
    this->where_to_cut = sVar3;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_88);
  }
  return;
}

Assistant:

void Vector_distances_in_diagram<F>::compute_average(const std::vector<Vector_distances_in_diagram*>& to_average) {
  if (to_average.size() == 0) {
    (*this) = Vector_distances_in_diagram<F>();
    return;
  }

  size_t maximal_length_of_vector = 0;
  for (size_t i = 0; i != to_average.size(); ++i) {
    if (to_average[i]->sorted_vector_of_distances.size() > maximal_length_of_vector) {
      maximal_length_of_vector = to_average[i]->sorted_vector_of_distances.size();
    }
  }

  std::vector<double> av(maximal_length_of_vector, 0);
  for (size_t i = 0; i != to_average.size(); ++i) {
    for (size_t j = 0; j != to_average[i]->sorted_vector_of_distances.size(); ++j) {
      av[j] += to_average[i]->sorted_vector_of_distances[j];
    }
  }

  for (size_t i = 0; i != maximal_length_of_vector; ++i) {
    av[i] /= static_cast<double>(to_average.size());
  }
  this->sorted_vector_of_distances = av;
  this->where_to_cut = av.size();
}